

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Option(FormattingScene *this,string *name,string *value,FileLoc loc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string nName;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  string local_88 [12];
  int in_stack_ffffffffffffff84;
  FormattingScene *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  string local_38 [56];
  
  anon_unknown_146::normalizeArg(in_stack_ffffffffffffff98);
  bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff5f,
                                                  in_stack_ffffffffffffff58));
  if (!bVar1) {
    bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff5f,
                                                    in_stack_ffffffffffffff58));
    if (!bVar1) {
      indent_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(local_88);
      goto LAB_0067e833;
    }
  }
  indent_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
LAB_0067e833:
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void FormattingScene::Option(const std::string &name, const std::string &value,
                             FileLoc loc) {
    std::string nName = normalizeArg(name);
    if (nName == "msereferenceimage" || nName == "msereferenceout")
        Printf("%sOption \"%s\" \"%s\"\n", indent(), name, value);
    else
        Printf("%sOption \"%s\" %s\n", indent(), name, value);
}